

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O2

RefCntAutoPtr<Diligent::DeviceContextGLImpl> __thiscall
Diligent::RenderDeviceBase<Diligent::EngineGLImplTraits>::GetImmediateContext
          (RenderDeviceBase<Diligent::EngineGLImplTraits> *this,size_t Ctx)

{
  ulong in_RDX;
  
  if (in_RDX < (ulong)(*(long *)(Ctx + 0x4d0) - *(long *)(Ctx + 0x4c8) >> 4)) {
    RefCntWeakPtr<Diligent::DeviceContextGLImpl>::Lock
              ((RefCntWeakPtr<Diligent::DeviceContextGLImpl> *)this);
  }
  else {
    (this->super_ObjectBase<Diligent::IRenderDeviceGL>).
    super_RefCountedObject<Diligent::IRenderDeviceGL>.super_IRenderDeviceGL.super_IRenderDevice.
    super_IObject._vptr_IObject = (_func_int **)0x0;
  }
  return (RefCntAutoPtr<Diligent::DeviceContextGLImpl>)(DeviceContextGLImpl *)this;
}

Assistant:

RefCntAutoPtr<DeviceContextImplType> GetImmediateContext(size_t Ctx)
    {
        return Ctx < m_wpImmediateContexts.size() ?
            m_wpImmediateContexts[Ctx].Lock() :
            RefCntAutoPtr<DeviceContextImplType>{};
    }